

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O3

bool lunasvg::matchSimpleSelector(SimpleSelector *selector,SVGElement *element)

{
  pointer pAVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pPVar4;
  pointer pSVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  string *psVar9;
  size_type sVar10;
  SVGElement *pSVar11;
  size_type __rlen;
  ulong __n;
  size_t __n_00;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *subSelector;
  pointer pAVar12;
  pointer pvVar13;
  pointer __s2;
  pointer __s1;
  PseudoClassSelector *sel;
  pointer pPVar14;
  SimpleSelector *simpleSelector;
  pointer pSVar15;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  pointer local_50;
  string_view local_48;
  _List_node_base *local_38;
  
  if ((selector->id == Star) || (selector->id == element->m_id)) {
    pAVar1 = (selector->attributeSelectors).
             super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar12 = (selector->attributeSelectors).
                   super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                   ._M_impl.super__Vector_impl_data._M_start; pAVar12 != pAVar1;
        pAVar12 = pAVar12 + 1) {
      psVar9 = SVGElement::getAttribute_abi_cxx11_(element,pAVar12->id);
      switch(pAVar12->matchType) {
      case None:
        if (psVar9->_M_string_length == 0) goto switchD_0011a9c6_default;
        break;
      case Equals:
        uVar2 = psVar9->_M_string_length;
        uVar3 = (pAVar12->value)._M_string_length;
        __n = uVar3;
        if (uVar2 < uVar3) {
          __n = uVar2;
        }
        if (__n == 0) {
          if (uVar2 != uVar3) goto switchD_0011a9c6_default;
        }
        else {
          iVar8 = bcmp((psVar9->_M_dataplus)._M_p,(pAVar12->value)._M_dataplus._M_p,__n);
          if (uVar2 != uVar3) goto switchD_0011a9c6_default;
          if (iVar8 != 0) {
            return false;
          }
        }
        break;
      case Contains:
        local_60._M_str = (psVar9->_M_dataplus)._M_p;
        local_60._M_len = psVar9->_M_string_length;
        sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (&local_60,(pAVar12->value)._M_dataplus._M_p,0,
                            (pAVar12->value)._M_string_length);
        if (sVar10 == 0xffffffffffffffff) {
          return false;
        }
        break;
      case Includes:
        local_60._M_str = (psVar9->_M_dataplus)._M_p;
        local_60._M_len = psVar9->_M_string_length;
        local_48._M_str = (pAVar12->value)._M_dataplus._M_p;
        local_48._M_len = (pAVar12->value)._M_string_length;
        bVar6 = includes(&local_60,&local_48);
        goto LAB_0011aaf7;
      case StartsWith:
        __n_00 = (pAVar12->value)._M_string_length;
        if (__n_00 - 1 < psVar9->_M_string_length) {
          __s1 = (pAVar12->value)._M_dataplus._M_p;
          __s2 = (psVar9->_M_dataplus)._M_p;
          goto LAB_0011aabc;
        }
        goto switchD_0011a9c6_default;
      case EndsWith:
        __n_00 = (pAVar12->value)._M_string_length;
        if (psVar9->_M_string_length <= __n_00 - 1) goto switchD_0011a9c6_default;
        __s1 = (pAVar12->value)._M_dataplus._M_p;
        __s2 = (psVar9->_M_dataplus)._M_p + (psVar9->_M_string_length - __n_00);
LAB_0011aabc:
        iVar8 = bcmp(__s1,__s2,__n_00);
        if (iVar8 != 0) goto switchD_0011a9c6_default;
        break;
      case DashEquals:
        local_60._M_str = (psVar9->_M_dataplus)._M_p;
        local_60._M_len = psVar9->_M_string_length;
        local_48._M_str = (pAVar12->value)._M_dataplus._M_p;
        local_48._M_len = (pAVar12->value)._M_string_length;
        bVar6 = dashequals(&local_60,&local_48);
LAB_0011aaf7:
        if (bVar6 == false) goto switchD_0011a9c6_default;
        break;
      default:
        goto switchD_0011a9c6_default;
      }
    }
    pPVar14 = (selector->pseudoClassSelectors).
              super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar4 = (selector->pseudoClassSelectors).
             super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = true;
    if (pPVar14 != pPVar4) {
      local_38 = (_List_node_base *)&element->m_children;
      do {
        switch(pPVar14->type) {
        case Empty:
          if ((((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                 *)&local_38->_M_next)->_M_impl)._M_node.super__List_node_base._M_next != local_38)
          goto switchD_0011a9c6_default;
          break;
        case Root:
          pSVar11 = (element->super_SVGNode).m_parentElement;
          goto joined_r0x0011ac93;
        case Is:
          pvVar13 = (pPVar14->subSelectors).
                    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_50 = (pPVar14->subSelectors).
                     super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (pvVar13 != local_50) {
            do {
              pSVar5 = (pvVar13->
                       super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pSVar15 = (pvVar13->
                             super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                             )._M_impl.super__Vector_impl_data._M_start; pSVar15 != pSVar5;
                  pSVar15 = pSVar15 + 1) {
                bVar7 = matchSimpleSelector(pSVar15,element);
                if (!bVar7) goto switchD_0011a9c6_default;
              }
              pvVar13 = pvVar13 + 1;
            } while (pvVar13 != local_50);
          }
          break;
        case Not:
          pvVar13 = (pPVar14->subSelectors).
                    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_50 = (pPVar14->subSelectors).
                     super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (pvVar13 != local_50) {
            do {
              pSVar5 = (pvVar13->
                       super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pSVar15 = (pvVar13->
                             super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                             )._M_impl.super__Vector_impl_data._M_start; pSVar15 != pSVar5;
                  pSVar15 = pSVar15 + 1) {
                bVar7 = matchSimpleSelector(pSVar15,element);
                if (bVar7) goto switchD_0011a9c6_default;
              }
              pvVar13 = pvVar13 + 1;
            } while (pvVar13 != local_50);
          }
          break;
        case FirstChild:
          pSVar11 = SVGElement::previousElement(element);
          goto joined_r0x0011ac93;
        case LastChild:
          goto switchD_0011ab60_caseD_6;
        case OnlyChild:
          pSVar11 = SVGElement::previousElement(element);
          if (pSVar11 != (SVGElement *)0x0) goto switchD_0011a9c6_default;
switchD_0011ab60_caseD_6:
          pSVar11 = SVGElement::nextElement(element);
joined_r0x0011ac93:
          if (pSVar11 != (SVGElement *)0x0) goto switchD_0011a9c6_default;
          break;
        case FirstOfType:
          while (pSVar11 = SVGElement::previousElement(element), pSVar11 != (SVGElement *)0x0) {
            if (pSVar11->m_id == element->m_id) goto switchD_0011a9c6_default;
          }
          break;
        case LastOfType:
          while (pSVar11 = SVGElement::nextElement(element), pSVar11 != (SVGElement *)0x0) {
            if (pSVar11->m_id == element->m_id) goto switchD_0011a9c6_default;
          }
          break;
        default:
          goto switchD_0011a9c6_default;
        }
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 != pPVar4);
    }
  }
  else {
switchD_0011a9c6_default:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool matchSimpleSelector(const SimpleSelector& selector, const SVGElement* element)
{
    if(selector.id != ElementID::Star && selector.id != element->id())
        return false;
    for(const auto& sel : selector.attributeSelectors) {
        if(!matchAttributeSelector(sel, element)) {
            return false;
        }
    }

    for(const auto& sel : selector.pseudoClassSelectors) {
        if(!matchPseudoClassSelector(sel, element)) {
            return false;
        }
    }

    return true;
}